

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_33c573::BuildEngineImpl::~BuildEngineImpl(BuildEngineImpl *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  BuildEngineImpl *this_local;
  
  (this->super_BuildDBDelegate)._vptr_BuildDBDelegate = (_func_int **)&PTR__BuildEngineImpl_0043bce0
  ;
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->buildEngineMutex);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  ::~vector(&this->ruleScanRecordBlocks);
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  ::~vector(&this->freeRuleScanRecords);
  std::condition_variable::~condition_variable(&this->finishedTaskInfosCondition);
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
  ::~vector(&this->finishedTaskInfos);
  std::
  deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
  ::~deque(&this->readyTaskInfos);
  std::
  unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
  ::~unordered_map(&this->taskInfos);
  std::
  unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
  ::~unordered_map(&this->ruleInfos);
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
  ::~vector(&this->ruleInfosToScan);
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  ::~vector(&this->finishedInputRequests);
  std::
  deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  ::~deque(&this->inputRequests);
  llvm::
  DenseSet<llbuild::core::CancellationDelegate_*,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>_>
  ::~DenseSet(&this->cancellationDelegates);
  std::
  unique_ptr<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>_>::
  ~unique_ptr(&this->executionQueue);
  std::__cxx11::string::~string((string *)&this->traceFile);
  std::
  unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
  ::~unique_ptr(&this->trace);
  std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::~unique_ptr
            (&this->db);
  llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::~StringMap(&this->keyTable);
  llbuild::core::BuildDBDelegate::~BuildDBDelegate(&this->super_BuildDBDelegate);
  return;
}

Assistant:

~BuildEngineImpl() {
    // Make sure that there aren't any currently running builds before
    // tearing down.
    std::lock_guard<std::mutex> lock(buildEngineMutex);
  }